

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O3

void __thiscall
ParseNodeBlock::ParseNodeBlock
          (ParseNodeBlock *this,charcount_t ichMin,charcount_t ichLim,int blockId,
          PnodeBlockType blockType)

{
  byte bVar1;
  
  (this->super_ParseNodeStmt).super_ParseNode.nop = knopBlock;
  (this->super_ParseNodeStmt).super_ParseNode.grfpn = 0;
  (this->super_ParseNodeStmt).super_ParseNode.location = 0xffffffff;
  bVar1 = this->field_0x5c;
  (this->super_ParseNodeStmt).super_ParseNode.field_0x1 =
       ((this->super_ParseNodeStmt).super_ParseNode.field_0x1 & 0xe0) + 1;
  (this->super_ParseNodeStmt).super_ParseNode.ichMin = ichMin;
  (this->super_ParseNodeStmt).super_ParseNode.ichLim = ichLim;
  (this->super_ParseNodeStmt).emitLabels = false;
  this->pnodeStmt = (ParseNodePtr)0x0;
  this->pnodeLastValStmt = (ParseNodePtr)0x0;
  this->pnodeLexVars = (ParseNodePtr)0x0;
  this->pnodeScopes = (ParseNodePtr)0x0;
  this->pnodeNext = (ParseNodePtr)0x0;
  this->scope = (Scope *)0x0;
  this->enclosingBlock = (ParseNodeBlock *)0x0;
  this->field_0x5c = bVar1 & 0xf0 | (byte)blockType & 3;
  this->blockId = blockId;
  if (blockType != Regular) {
    (this->super_ParseNodeStmt).super_ParseNode.grfpn = 0x200;
  }
  return;
}

Assistant:

ParseNodeBlock::ParseNodeBlock(charcount_t ichMin, charcount_t ichLim, int blockId, PnodeBlockType blockType)
    : ParseNodeStmt(knopBlock, ichMin, ichLim)
{
    this->pnodeScopes = nullptr;
    this->pnodeNext = nullptr;
    this->scope = nullptr;
    this->enclosingBlock = nullptr;
    this->pnodeLexVars = nullptr;
    this->pnodeStmt = nullptr;
    this->pnodeLastValStmt = nullptr;

    this->callsEval = false;
    this->childCallsEval = false;
    this->blockType = blockType;
    this->blockId = blockId;

    if (blockType != PnodeBlockType::Regular)
    {
        this->grfpn |= PNodeFlags::fpnSyntheticNode;
    }
}